

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
int_writer<unsigned_long,fmt::v5::basic_format_specs<wchar_t>>::dec_writer::operator()
          (dec_writer *this,wchar_t **it)

{
  int iVar1;
  bool bVar2;
  wchar_t *pwVar3;
  long lVar4;
  byte bVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  char local_28 [40];
  
  iVar1 = *(int *)(this + 8);
  lVar4 = (long)iVar1;
  if (lVar4 < 0) {
    __assert_fail("(num_digits >= 0) && \"invalid digit count\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tinfoilboy[P]sonne/extern/fmt/include/fmt/format.h"
                  ,0x3dd,
                  "Iterator fmt::internal::format_decimal(Iterator, UInt, int, ThousandsSep) [OutChar = wchar_t, UInt = unsigned long, Iterator = wchar_t *, ThousandsSep = fmt::internal::no_thousands_sep]"
                 );
  }
  uVar6 = *(ulong *)this;
  pcVar7 = local_28 + lVar4;
  uVar8 = uVar6;
  if (99 < uVar6) {
    do {
      uVar6 = uVar8 / 100;
      *(undefined2 *)(pcVar7 + -2) =
           *(undefined2 *)
            (internal::basic_data<void>::DIGITS + (ulong)(uint)((int)uVar8 + (int)uVar6 * -100) * 2)
      ;
      pcVar7 = pcVar7 + -2;
      bVar2 = 9999 < uVar8;
      uVar8 = uVar6;
    } while (bVar2);
  }
  pwVar3 = *it;
  if (uVar6 < 10) {
    bVar5 = (byte)uVar6 | 0x30;
    lVar9 = -1;
  }
  else {
    pcVar7[-1] = internal::basic_data<void>::DIGITS[(uVar6 * 2 & 0xffffffff) + 1];
    bVar5 = internal::basic_data<void>::DIGITS[uVar6 * 2 & 0x1fffffffe];
    lVar9 = -2;
  }
  pcVar7[lVar9] = bVar5;
  if (iVar1 != 0) {
    lVar9 = 0;
    do {
      *pwVar3 = (int)local_28[lVar9];
      pwVar3 = pwVar3 + 1;
      lVar9 = lVar9 + 1;
    } while (lVar4 != lVar9);
  }
  *it = pwVar3;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_decimal<char_type>(it, abs_value, num_digits);
      }